

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cc
# Opt level: O2

MoveList * search::movegen::generateAll(MoveList *__return_storage_ptr__,Board *pos,bool onlyCaps)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int i;
  long lVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->moves).super__Vector_base<board::Move,_std::allocator<board::Move>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar13 = pos->side == 0;
  lVar3 = 7;
  if (bVar13) {
    lVar3 = 1;
  }
  iVar2 = (uint)bVar13 * 2 + -1;
  for (lVar5 = 0; lVar5 < pos->pNum[lVar3]; lVar5 = lVar5 + 1) {
    uVar1 = pos->pList[lVar3][lVar5];
    if ((((!onlyCaps) && (iVar8 = uVar1 + iVar2 * 10, pos->board[iVar8] == 0)) &&
        (addPawnMove(uVar1,iVar8,0,pos->side,__return_storage_ptr__,pos),
        board::Board::RANKS[board::Board::SQ64[(int)uVar1]] ==
        *(int *)((long)&PAWN_RANK + ((long)pos->side ^ 1U) * 4))) &&
       (iVar8 = uVar1 + iVar2 * 0x14, pos->board[iVar8] == 0)) {
      addQuietMove(iVar8 * 0x80 | uVar1 | 0x80000,__return_storage_ptr__,pos);
    }
    iVar8 = uVar1 + iVar2 * 9;
    if (board::Board::SQ64[iVar8] != 99) {
      if ((board::Board::PIECE_COLOR[pos->board[iVar8]] ^ pos->side) == 1) {
        addPawnMove(uVar1,iVar8,pos->board[iVar8],pos->side,__return_storage_ptr__,pos);
      }
    }
    iVar11 = uVar1 + iVar2 * 0xb;
    if (board::Board::SQ64[iVar11] != 99) {
      if ((board::Board::PIECE_COLOR[pos->board[iVar11]] ^ pos->side) == 1) {
        addPawnMove(uVar1,iVar11,pos->board[iVar11],pos->side,__return_storage_ptr__,pos);
      }
    }
    iVar9 = pos->enPas;
    if (iVar9 != 99) {
      if (iVar8 == iVar9) {
        addEnPasMove(iVar8 * 0x80 | uVar1 | 0x40000,__return_storage_ptr__);
        iVar9 = pos->enPas;
      }
      if (iVar11 == iVar9) {
        addEnPasMove(iVar11 * 0x80 | uVar1 | 0x40000,__return_storage_ptr__);
      }
    }
  }
  iVar2 = pos->side;
  lVar3 = 0;
  do {
    if (lVar3 == 3) {
      iVar2 = pos->side;
      for (uVar4 = 0; uVar4 != 2; uVar4 = uVar4 + 1) {
        iVar8 = *(int *)(NON_SLIDERS + (uVar4 | (uint)(iVar2 != 0) * 2) * 4);
        for (lVar3 = 0; lVar3 < pos->pNum[iVar8]; lVar3 = lVar3 + 1) {
          uVar1 = pos->pList[iVar8][lVar3];
          for (lVar5 = 0; (lVar5 != 8 && (board::Board::MOVE_DIR[iVar8][lVar5] != 0));
              lVar5 = lVar5 + 1) {
            iVar9 = board::Board::MOVE_DIR[iVar8][lVar5] + uVar1;
            iVar11 = pos->board[iVar9];
            if ((long)iVar11 == 0) {
              if (!onlyCaps) {
                addQuietMove(iVar9 * 0x80 | uVar1,__return_storage_ptr__,pos);
              }
            }
            else if ((iVar11 != 99) && ((pos->side ^ board::Board::PIECE_COLOR[iVar11]) == 1)) {
              addCaptureMove(iVar9 * 0x80 | uVar1 | iVar11 << 0xe,__return_storage_ptr__,pos);
            }
          }
        }
      }
      if (onlyCaps) {
        return __return_storage_ptr__;
      }
      if (pos->side == 0) {
        if (((((pos->castlePerm & 1U) != 0) && (pos->board[0x1a] == 0)) && (pos->board[0x1b] == 0))
           && ((bVar13 = board::Board::sqAttacked(pos,0x19,1), !bVar13 &&
               (bVar13 = board::Board::sqAttacked(pos,0x1a,1), !bVar13)))) {
          addQuietMove(0x1000d99,__return_storage_ptr__,pos);
        }
        if ((pos->castlePerm & 2) == 0) {
          return __return_storage_ptr__;
        }
        if (pos->board[0x18] != 0) {
          return __return_storage_ptr__;
        }
        if (pos->board[0x17] != 0) {
          return __return_storage_ptr__;
        }
        if (pos->board[0x16] != 0) {
          return __return_storage_ptr__;
        }
        bVar13 = board::Board::sqAttacked(pos,0x19,1);
        if (bVar13) {
          return __return_storage_ptr__;
        }
        bVar13 = board::Board::sqAttacked(pos,0x18,1);
        iVar2 = 0x1000b99;
      }
      else {
        if ((((pos->castlePerm & 4U) != 0) && (pos->board[0x60] == 0)) &&
           ((pos->board[0x61] == 0 &&
            ((bVar13 = board::Board::sqAttacked(pos,0x5f,0), !bVar13 &&
             (bVar13 = board::Board::sqAttacked(pos,0x60,0), !bVar13)))))) {
          addQuietMove(0x10030df,__return_storage_ptr__,pos);
        }
        if ((pos->castlePerm & 8) == 0) {
          return __return_storage_ptr__;
        }
        if (pos->board[0x5e] != 0) {
          return __return_storage_ptr__;
        }
        if (pos->board[0x5d] != 0) {
          return __return_storage_ptr__;
        }
        if (pos->board[0x5c] != 0) {
          return __return_storage_ptr__;
        }
        bVar13 = board::Board::sqAttacked(pos,0x5f,0);
        if (bVar13) {
          return __return_storage_ptr__;
        }
        bVar13 = board::Board::sqAttacked(pos,0x5e,0);
        iVar2 = 0x1002edf;
      }
      if (bVar13 == false) {
        addQuietMove(iVar2,__return_storage_ptr__,pos);
      }
      return __return_storage_ptr__;
    }
    iVar8 = *(int *)(SLIDERS + ((ulong)(iVar2 != 0) * 3 + lVar3) * 4);
    for (lVar5 = 0; lVar5 < pos->pNum[iVar8]; lVar5 = lVar5 + 1) {
      uVar1 = pos->pList[iVar8][lVar5];
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        iVar11 = board::Board::MOVE_DIR[iVar8][lVar10];
        lVar6 = (long)iVar11;
        if (lVar6 == 0) break;
        uVar12 = (iVar11 + uVar1) * 0x80;
        piVar7 = pos->board + lVar6 + (int)uVar1;
        while( true ) {
          iVar9 = *piVar7;
          if ((long)iVar9 != 0) break;
          if (!onlyCaps) {
            addQuietMove(uVar12 | uVar1,__return_storage_ptr__,pos);
          }
          uVar12 = uVar12 + iVar11 * 0x80;
          piVar7 = piVar7 + lVar6;
        }
        if ((iVar9 != 99) && ((pos->side ^ board::Board::PIECE_COLOR[iVar9]) == 1)) {
          addCaptureMove(uVar12 | uVar1 | iVar9 << 0xe,__return_storage_ptr__,pos);
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

search::MoveList search::movegen::generateAll(board::Board& pos, const bool onlyCaps)
{
    MoveList moves;
    int square;
    int piece;
    int offset;
    int direction;
    int targetSquare;
    pos.getSide() == board::WHITE ? piece = board::WP : piece = board::BP;
    pos.getSide() == board::WHITE ? offset = 1 : offset = -1;
    for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
        square = pos.getPieceList(piece)[pceNum];
        if (!onlyCaps) {
            if (pos.getSquare(square + offset * 10) == board::EMPTY) {
                addPawnMove(square, square + offset * 10, board::EMPTY, pos.getSide(), moves, pos);
                if (board::Board::RANKS[board::Board::SQ64[square]] == PAWN_RANK[(pos.getSide() ^ 1)] &&
                    pos.getSquare(square + offset * 20) == board::EMPTY) {
                    addQuietMove(board::Move::MOVE(square, square + offset * 20, board::EMPTY, board::EMPTY,
                                                   board::Move::MFLAGPS),
                                 moves, pos);
                }
            }
        }
        if (board::Board::SQ64[square + offset * 9] != board::NO_SQ &&
            board::Board::PIECE_COLOR[pos.getSquare(square + offset * 9)] == (pos.getSide() ^ 1)) {
            addPawnMove(square, square + offset * 9, pos.getSquare(square + offset * 9), pos.getSide(), moves, pos);
        }
        if (board::Board::SQ64[square + offset * 11] != board::NO_SQ &&
            board::Board::PIECE_COLOR[pos.getSquare(square + offset * 11)] == (pos.getSide() ^ 1)) {
            addPawnMove(square, square + offset * 11, pos.getSquare(square + offset * 11), pos.getSide(), moves, pos);
        }
        if (pos.getEnPas() != board::NO_SQ) {
            if (square + offset * 9 == pos.getEnPas()) {
                addEnPasMove(
                    board::Move::MOVE(square, square + offset * 9, board::EMPTY, board::EMPTY, board::Move::MFLAGEP),
                    moves);
            }
            if (square + offset * 11 == pos.getEnPas()) {
                addEnPasMove(
                    board::Move::MOVE(square, square + offset * 11, board::EMPTY, board::EMPTY, board::Move::MFLAGEP),
                    moves);
            }
        }
    }
    pos.getSide() == board::WHITE ? offset = 0 : offset = 3;
    for (int index = 0; index < 3; index++) {
        piece = SLIDERS[index + offset];
        for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
            square = pos.getPieceList(piece)[pceNum];
            for (int i = 0; i < 8 && board::Board::MOVE_DIR[piece][i] != 0; i++) {
                direction = board::Board::MOVE_DIR[piece][i];
                targetSquare = square + direction;
                while (pos.getSquare(targetSquare) != board::NO_SQ) {
                    if (pos.getSquare(targetSquare) != board::EMPTY) {
                        if (board::Board::PIECE_COLOR[pos.getSquare(targetSquare)] == (pos.getSide() ^ 1)) {
                            addCaptureMove(
                                board::Move::MOVE(square, targetSquare, pos.getSquare(targetSquare), board::EMPTY, 0),
                                moves, pos);
                        }
                        break;
                    }
                    if (!onlyCaps) {
                        addQuietMove(board::Move::MOVE(square, targetSquare, board::EMPTY, board::EMPTY, 0), moves,
                                     pos);
                    }
                    targetSquare += direction;
                }
            }
        }
    }
    pos.getSide() == board::WHITE ? offset = 0 : offset = 2;
    for (int index = 0; index < 2; index++) {
        piece = NON_SLIDERS[index + offset];
        for (int pceNum = 0; pceNum < pos.getPieceNum(piece); pceNum++) {
            square = pos.getPieceList(piece)[pceNum];
            for (int i = 0; i < 8 && board::Board::MOVE_DIR[piece][i] != 0; i++) {
                direction = board::Board::MOVE_DIR[piece][i];
                targetSquare = square + direction;
                if (pos.getSquare(targetSquare) == board::NO_SQ) {
                    continue;
                }
                if (pos.getSquare(targetSquare) != board::EMPTY) {
                    if (board::Board::PIECE_COLOR[pos.getSquare(targetSquare)] == (pos.getSide() ^ 1)) {
                        addCaptureMove(
                            board::Move::MOVE(square, targetSquare, pos.getSquare(targetSquare), board::EMPTY, 0),
                            moves, pos);
                    }
                    continue;
                }
                if (!onlyCaps) {
                    addQuietMove(board::Move::MOVE(square, targetSquare, board::EMPTY, board::EMPTY, 0), moves, pos);
                }
            }
        }
    }
    if (!onlyCaps) {
        if (pos.getSide() == board::WHITE) {
            if (pos.getCastlePerm() & board::WKCA) {
                if (pos.getSquare(board::F1) == board::EMPTY && pos.getSquare(board::G1) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E1, board::BLACK) && !pos.sqAttacked(board::F1, board::BLACK)) {
                        addQuietMove(
                            board::Move::MOVE(board::E1, board::G1, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
            if (pos.getCastlePerm() & board::WQCA) {
                if (pos.getSquare(board::D1) == board::EMPTY && pos.getSquare(board::C1) == board::EMPTY &&
                    pos.getSquare(board::B1) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E1, board::BLACK) && !pos.sqAttacked(board::D1, board::BLACK)) {
                        addQuietMove(
                            board::Move::MOVE(board::E1, board::C1, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
        }
        else {
            if (pos.getCastlePerm() & board::BKCA) {
                if (pos.getSquare(board::F8) == board::EMPTY && pos.getSquare(board::G8) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E8, board::WHITE) && !pos.sqAttacked(board::F8, board::WHITE)) {
                        addQuietMove(
                            board::Move::MOVE(board::E8, board::G8, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
            if (pos.getCastlePerm() & board::BQCA) {
                if (pos.getSquare(board::D8) == board::EMPTY && pos.getSquare(board::C8) == board::EMPTY &&
                    pos.getSquare(board::B8) == board::EMPTY) {
                    if (!pos.sqAttacked(board::E8, board::WHITE) && !pos.sqAttacked(board::D8, board::WHITE)) {
                        addQuietMove(
                            board::Move::MOVE(board::E8, board::C8, board::EMPTY, board::EMPTY, board::Move::MFLAGCA),
                            moves, pos);
                    }
                }
            }
        }
    }
    return moves;
}